

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedIterations::Cleanup(AdvancedIterations *this)

{
  AdvancedIterations *this_local;
  
  glu::CallLogWrapper::glDisable
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c89);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_po);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_vao);
  glu::CallLogWrapper::glDeleteTransformFeedbacks
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_xfo);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_buffer);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisable(GL_RASTERIZER_DISCARD);
		glUseProgram(0);
		glDeleteProgram(m_po);
		glDeleteVertexArrays(2, m_vao);
		glDeleteTransformFeedbacks(2, m_xfo);
		glDeleteBuffers(2, m_buffer);
		return NO_ERROR;
	}